

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_helper.c
# Opt level: O0

void helper_v7m_preserve_fp_state_arm(CPUARMState *env)

{
  uint uVar1;
  uint uVar2;
  uint32_t uVar3;
  _Bool _Var4;
  _Bool _Var5;
  ARMMMUIdx mmu_idx_00;
  uint32_t uVar6;
  ArchCPU_conflict *cpu_00;
  uint64_t *puVar7;
  uint64_t uVar8;
  uint64_t uVar9;
  int iVar10;
  bool is_secure_00;
  bool bVar11;
  _Bool local_4a;
  int local_48;
  int i_1;
  uint32_t shi;
  uint32_t slo;
  uint32_t faddr;
  uint64_t dn;
  int local_28;
  ARMMMUIdx mmu_idx;
  int i;
  _Bool take_exception;
  _Bool ts;
  _Bool stacked_ok;
  uint32_t fpcar;
  _Bool splimviol;
  _Bool is_priv;
  _Bool negpri;
  _Bool is_secure;
  ARMCPU *cpu;
  CPUARMState *env_local;
  
  cpu_00 = env_archcpu(env);
  is_secure_00 = ((env->v7m).fpccr[1] & 4) != 0;
  uVar1 = (env->v7m).fpccr[1];
  _Var4 = (_Bool)((((env->v7m).fpccr[is_secure_00] & 2) != 0 ^ 0xffU) & 1);
  uVar2 = (env->v7m).fpccr[is_secure_00];
  uVar3 = (env->v7m).fpcar[is_secure_00];
  mmu_idx._3_1_ = 1;
  bVar11 = false;
  if (is_secure_00) {
    bVar11 = ((env->v7m).fpccr[1] & 0x4000000) != 0;
  }
  _Var5 = v7m_cpacr_pass(env,is_secure_00,_Var4);
  if (_Var5) {
    if ((!is_secure_00) && (uVar6 = extract32((env->v7m).nsacr,10,1), uVar6 == 0)) {
      (env->v7m).cfsr[1] = (env->v7m).cfsr[1] | 0x80000;
      mmu_idx._3_1_ = 0;
    }
  }
  else {
    (env->v7m).cfsr[is_secure_00] = (env->v7m).cfsr[is_secure_00] | 0x80000;
    mmu_idx._3_1_ = 0;
  }
  if (((uVar2 & 0x200) == 0) && (mmu_idx._3_1_ != 0)) {
    mmu_idx_00 = arm_v7m_mmu_idx_all_arm
                           (env,is_secure_00,_Var4,(_Bool)(((uVar1 & 0x10) != 0 ^ 0xffU) & 1));
    local_28 = 0;
    while( true ) {
      iVar10 = 0x10;
      if (bVar11) {
        iVar10 = 0x20;
      }
      if (iVar10 <= local_28) break;
      puVar7 = aa32_vfp_dreg(env,local_28 / 2);
      uVar9 = *puVar7;
      shi = uVar3 + local_28 * 4;
      uVar8 = extract64(uVar9,0,0x20);
      uVar9 = extract64(uVar9,0x20,0x20);
      if (0xf < local_28) {
        shi = shi + 8;
      }
      local_4a = false;
      if (mmu_idx._3_1_ != 0) {
        _Var4 = v7m_stack_write(cpu_00,shi,(uint32_t)uVar8,mmu_idx_00,STACK_LAZYFP);
        local_4a = false;
        if (_Var4) {
          local_4a = v7m_stack_write(cpu_00,shi + 4,(uint32_t)uVar9,mmu_idx_00,STACK_LAZYFP);
        }
      }
      mmu_idx._3_1_ = local_4a;
      local_28 = local_28 + 2;
    }
    if (mmu_idx._3_1_ != 0) {
      uVar6 = vfp_get_fpscr_arm(env);
      v7m_stack_write(cpu_00,uVar3 + 0x40,uVar6,mmu_idx_00,STACK_LAZYFP);
    }
  }
  (env->v7m).fpccr[is_secure_00] = (env->v7m).fpccr[is_secure_00] & 0xfffffffe;
  if (bVar11) {
    for (local_48 = 0; local_48 < 0x20; local_48 = local_48 + 2) {
      puVar7 = aa32_vfp_dreg(env,local_48 / 2);
      *puVar7 = 0;
    }
    vfp_set_fpscr_arm(env,0);
  }
  return;
}

Assistant:

void HELPER(v7m_preserve_fp_state)(CPUARMState *env)
{
    /*
     * Preserve FP state (because LSPACT was set and we are about
     * to execute an FP instruction). This corresponds to the
     * PreserveFPState() pseudocode.
     * We may throw an exception if the stacking fails.
     */
    ARMCPU *cpu = env_archcpu(env);
    bool is_secure = env->v7m.fpccr[M_REG_S] & R_V7M_FPCCR_S_MASK;
    bool negpri = !(env->v7m.fpccr[M_REG_S] & R_V7M_FPCCR_HFRDY_MASK);
    bool is_priv = !(env->v7m.fpccr[is_secure] & R_V7M_FPCCR_USER_MASK);
    bool splimviol = env->v7m.fpccr[is_secure] & R_V7M_FPCCR_SPLIMVIOL_MASK;
    uint32_t fpcar = env->v7m.fpcar[is_secure];
    bool stacked_ok = true;
    bool ts = is_secure && (env->v7m.fpccr[M_REG_S] & R_V7M_FPCCR_TS_MASK);
    bool take_exception;

    /* Check the background context had access to the FPU */
    if (!v7m_cpacr_pass(env, is_secure, is_priv)) {
        // armv7m_nvic_set_pending_lazyfp(env->nvic, ARMV7M_EXCP_USAGE, is_secure);
        env->v7m.cfsr[is_secure] |= R_V7M_CFSR_NOCP_MASK;
        stacked_ok = false;
    } else if (!is_secure && !extract32(env->v7m.nsacr, 10, 1)) {
        // armv7m_nvic_set_pending_lazyfp(env->nvic, ARMV7M_EXCP_USAGE, M_REG_S);
        env->v7m.cfsr[M_REG_S] |= R_V7M_CFSR_NOCP_MASK;
        stacked_ok = false;
    }

    if (!splimviol && stacked_ok) {
        /* We only stack if the stack limit wasn't violated */
        int i;
        ARMMMUIdx mmu_idx;

        mmu_idx = arm_v7m_mmu_idx_all(env, is_secure, is_priv, negpri);
        for (i = 0; i < (ts ? 32 : 16); i += 2) {
            uint64_t dn = *aa32_vfp_dreg(env, i / 2);
            uint32_t faddr = fpcar + 4 * i;
            uint32_t slo = extract64(dn, 0, 32);
            uint32_t shi = extract64(dn, 32, 32);

            if (i >= 16) {
                faddr += 8; /* skip the slot for the FPSCR */
            }
            stacked_ok = stacked_ok &&
                v7m_stack_write(cpu, faddr, slo, mmu_idx, STACK_LAZYFP) &&
                v7m_stack_write(cpu, faddr + 4, shi, mmu_idx, STACK_LAZYFP);
        }

        stacked_ok = stacked_ok &&
            v7m_stack_write(cpu, fpcar + 0x40,
                            vfp_get_fpscr(env), mmu_idx, STACK_LAZYFP);
    }

    /*
     * We definitely pended an exception, but it's possible that it
     * might not be able to be taken now. If its priority permits us
     * to take it now, then we must not update the LSPACT or FP regs,
     * but instead jump out to take the exception immediately.
     * If it's just pending and won't be taken until the current
     * handler exits, then we do update LSPACT and the FP regs.
     */
    // take_exception = !stacked_ok &&
    //     armv7m_nvic_can_take_pending_exception(env->nvic);
    /* consider armv7m_nvic_can_take_pending_exception() always return false.
        in unicorn */
    take_exception = false;

    if (take_exception) {
        raise_exception_ra(env, EXCP_LAZYFP, 0, 1, GETPC());
    }

    env->v7m.fpccr[is_secure] &= ~R_V7M_FPCCR_LSPACT_MASK;

    if (ts) {
        /* Clear s0 to s31 and the FPSCR */
        int i;

        for (i = 0; i < 32; i += 2) {
            *aa32_vfp_dreg(env, i / 2) = 0;
        }
        vfp_set_fpscr(env, 0);
    }
    /*
     * Otherwise s0 to s15 and FPSCR are UNKNOWN; we choose to leave them
     * unchanged.
     */
}